

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhexview.cpp
# Opt level: O2

void __thiscall QHexView::checkOptions(QHexView *this)

{
  uint uVar1;
  undefined8 uVar2;
  uint uVar3;
  QPalette *this_00;
  QColor *pQVar4;
  double dVar5;
  
  uVar1 = (this->m_options).linelength;
  if (uVar1 < (this->m_options).grouplength) {
    (this->m_options).grouplength = uVar1;
  }
  uVar3 = calcAddressWidth(this);
  uVar1 = (this->m_options).addresswidth;
  if (uVar3 < uVar1) {
    uVar3 = uVar1;
  }
  (this->m_options).addresswidth = uVar3;
  dVar5 = floor((double)(this->m_options).grouplength * 0.5);
  (this->m_options).grouplength = 1 << ((byte)(int)dVar5 & 0x1f);
  if ((this->m_options).headercolor.cspec == Invalid) {
    this_00 = (QPalette *)QWidget::palette();
    pQVar4 = QPalette::color(this_00,Active,Highlight);
    uVar2 = *(undefined8 *)((long)&pQVar4->ct + 2);
    *(undefined8 *)&(this->m_options).headercolor = *(undefined8 *)pQVar4;
    *(undefined8 *)((long)&(this->m_options).headercolor.ct + 2) = uVar2;
  }
  return;
}

Assistant:

void QHexView::checkOptions() {
    if(m_options.grouplength > m_options.linelength)
        m_options.grouplength = m_options.linelength;

    m_options.addresswidth =
        qMax<unsigned int>(m_options.addresswidth, this->calcAddressWidth());

    // Round to nearest multiple of 2
    m_options.grouplength =
        1u << (static_cast<unsigned int>(qFloor(m_options.grouplength / 2.0)));

    if(m_options.grouplength <= 1)
        m_options.grouplength = 1;

    if(!m_options.headercolor.isValid())
        m_options.headercolor =
            this->palette().color(QPalette::Normal, QPalette::Highlight);
}